

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O3

int msgbuf_write(msgbuf *msgbuf)

{
  bool bVar1;
  size_t *psVar2;
  size_t sVar3;
  int *piVar4;
  int iVar5;
  ibuf *piVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  msghdr msg;
  iovec iov [1024];
  anon_union_24_2_43a74ec4 cmsgbuf;
  msghdr local_4088;
  iovec local_4048 [1024];
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  memset(local_4048,0,0x4000);
  local_4088.msg_name = (void *)0x0;
  local_4088.msg_namelen = 0;
  local_4088._12_4_ = 0;
  local_4088.msg_control = (undefined8 *)0x0;
  local_4088.msg_controllen = 0;
  local_4088.msg_flags = 0;
  local_4088._52_4_ = 0;
  psVar2 = &local_4048[0].iov_len;
  piVar6 = (ibuf *)msgbuf;
  do {
    piVar6 = (piVar6->entry).tqe_next;
    local_4088.msg_iov = local_4048;
    if ((piVar6 == (ibuf *)0x0) || (0x3ff < uVar7)) {
      local_4088.msg_iovlen = uVar7;
      if (piVar6 == (ibuf *)0x0) {
        bVar1 = true;
        goto LAB_00106489;
      }
      iVar5 = piVar6->fd;
      if (iVar5 == -1) goto LAB_00106484;
      break;
    }
    sVar3 = piVar6->rpos;
    ((iovec *)(psVar2 + -1))->iov_base = piVar6->buf + sVar3;
    *psVar2 = piVar6->wpos - sVar3;
    uVar7 = uVar7 + 1;
    iVar5 = piVar6->fd;
    psVar2 = psVar2 + 2;
    local_4088.msg_iovlen = uVar7;
  } while (iVar5 == -1);
  local_4088.msg_control = &local_48;
  local_4088.msg_controllen = 0x18;
  local_48 = 0x14;
  local_40 = 0x100000001;
  local_38 = iVar5;
LAB_00106484:
  bVar1 = false;
LAB_00106489:
  do {
    sVar3 = sendmsg(msgbuf->fd,&local_4088,0);
    if (sVar3 != 0xffffffffffffffff) {
      if (sVar3 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        iVar5 = 0;
      }
      else {
        if ((!bVar1) && (piVar6->fd != -1)) {
          close(piVar6->fd);
          piVar6->fd = -1;
        }
        msgbuf_drain(msgbuf,sVar3);
        iVar5 = 1;
      }
      goto LAB_001064fe;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if (*piVar4 == 0x69) {
    *piVar4 = 0xb;
  }
  iVar5 = -1;
LAB_001064fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int
msgbuf_write(struct msgbuf *msgbuf)
{
	struct iovec	 iov[IOV_MAX];
	struct ibuf	*buf;
	unsigned int	 i = 0;
	ssize_t		 n;
	struct msghdr	 msg;
	struct cmsghdr	*cmsg;
	union {
		struct cmsghdr	hdr;
		char		buf[CMSG_SPACE(sizeof(int))];
	} cmsgbuf;

	bzero(&iov, sizeof(iov));
	bzero(&msg, sizeof(msg));
	TAILQ_FOREACH(buf, &msgbuf->bufs, entry) {
		if (i >= IOV_MAX)
			break;
		iov[i].iov_base = buf->buf + buf->rpos;
		iov[i].iov_len = buf->wpos - buf->rpos;
		i++;
		if (buf->fd != -1)
			break;
	}

	msg.msg_iov = iov;
	msg.msg_iovlen = i;

	if (buf != NULL && buf->fd != -1) {
		msg.msg_control = (caddr_t)&cmsgbuf.buf;
		msg.msg_controllen = sizeof(cmsgbuf.buf);
		cmsg = CMSG_FIRSTHDR(&msg);
		cmsg->cmsg_len = CMSG_LEN(sizeof(int));
		cmsg->cmsg_level = SOL_SOCKET;
		cmsg->cmsg_type = SCM_RIGHTS;
		*(int *)CMSG_DATA(cmsg) = buf->fd;
	}

again:
	if ((n = sendmsg(msgbuf->fd, &msg, 0)) == -1) {
		if (errno == EINTR)
			goto again;
		if (errno == ENOBUFS)
			errno = EAGAIN;
		return (-1);
	}

	if (n == 0) {			/* connection closed */
		errno = 0;
		return (0);
	}

	/*
	 * assumption: fd got sent if sendmsg sent anything
	 * this works because fds are passed one at a time
	 */
	if (buf != NULL && buf->fd != -1) {
		close(buf->fd);
		buf->fd = -1;
	}

	msgbuf_drain(msgbuf, n);

	return (1);
}